

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O0

void rw::uninstColor(int type,RGBA *dst,uint8 *src,uint32 numVertices,uint32 stride)

{
  uint local_2c;
  uint32 i;
  uint32 stride_local;
  uint32 numVertices_local;
  uint8 *src_local;
  RGBA *dst_local;
  int type_local;
  
  local_2c = 0;
  _stride_local = src;
  src_local = &dst->red;
  for (; local_2c < numVertices; local_2c = local_2c + 1) {
    *src_local = _stride_local[2];
    src_local[1] = _stride_local[1];
    src_local[2] = *_stride_local;
    src_local[3] = _stride_local[3];
    _stride_local = _stride_local + stride;
    src_local = src_local + 4;
  }
  return;
}

Assistant:

void
uninstColor(int type, RGBA *dst, uint8 *src, uint32 numVertices, uint32 stride)
{
	assert(type == VERT_ARGB);
	for(uint32 i = 0; i < numVertices; i++){
		dst->red = src[2];
		dst->green = src[1];
		dst->blue = src[0];
		dst->alpha = src[3];
		src += stride;
		dst++;
	}
}